

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * fio_malloc(size_t size)

{
  void *mem;
  size_t size_local;
  
  if (size == 0) {
    size_local = (size_t)&on_malloc_zero;
  }
  else if (size < 0x4000) {
    arena_enter();
    size_local = (size_t)block_slice((short)(size >> 4) + (ushort)((size & 0xf) != 0));
    arena_exit();
  }
  else {
    size_local = (size_t)big_alloc(size);
  }
  return (void *)size_local;
}

Assistant:

void *fio_malloc(size_t size) {
#if FIO_OVERRIDE_MALLOC
  if (!arenas)
    fio_mem_init();
#endif
  if (!size) {
    /* changed behavior prevents "allocation failed" test for `malloc(0)` */
    return (void *)(&on_malloc_zero);
  }
  if (size >= FIO_MEMORY_BLOCK_ALLOC_LIMIT) {
    /* system allocation - must be block aligned */
    // FIO_LOG_WARNING("fio_malloc re-routed to mmap - big allocation");
    return big_alloc(size);
  }
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  size = (size >> 4) + (!!(size & 15));
  arena_enter();
  void *mem = block_slice(size);
  arena_exit();
  return mem;
}